

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

string * __thiscall
helics::CloneFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,CloneFilterOperation *this,string_view property)

{
  pointer pbVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *address;
  pointer pbVar3;
  handle handle;
  unique_lock<std::shared_mutex> local_38;
  
  if ((property._M_len == 8) && (*(long *)property._M_str == 0x79726576696c6564)) {
    local_38._M_device = &(this->deliveryAddresses).m_mutex;
    local_38._M_owns = false;
    std::unique_lock<std::shared_mutex>::lock(&local_38);
    local_38._M_owns = true;
    pbVar3 = (this->deliveryAddresses).m_obj.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->deliveryAddresses).m_obj.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 == pbVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((long)pbVar1 - (long)pbVar3 == 0x20) {
        pcVar2 = (pbVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar3->_M_string_length);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
        pbVar1 = (this->deliveryAddresses).m_obj.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar3 = (this->deliveryAddresses).m_obj.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1;
            pbVar3 = pbVar3 + 1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,'\"');
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,'\"');
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
      }
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CloneFilterOperation::getString(std::string_view property)
{
    if (property == "delivery") {
        auto handle = deliveryAddresses.lock();
        if (handle->empty()) {
            return {};
        }
        if (handle->size() == 1) {
            return *(handle->begin());
        }
        std::string results{"["};
        for (auto& address : handle) {
            results.push_back('"');
            results.append(address);
            results.push_back('"');
            results.push_back(',');
        }
        results.pop_back();
        results.push_back(']');
        return results;
    }
    return FilterOperations::getString(property);
}